

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O2

int modify_field(void *basep,field_s *field,char *data)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  ulong uVar8;
  int local_48;
  int val;
  char *local_40;
  float fval;
  
  if (1 < g_debug) {
    fprintf(_stderr,"+d modifying field \'%s\' with \'%s\'\n",field->name,data);
  }
  if ((data == (char *)0x0) || (sVar3 = strlen(data), sVar3 == 0)) {
    pcVar4 = "** no data for \'%s\' field modification\n";
LAB_0010b83b:
    fprintf(_stderr,pcVar4,field->name);
    return 1;
  }
  iVar2 = field->type;
  if (iVar2 == -0xfff) {
    pcVar4 = (char *)((long)basep + (long)field->offset);
    strncpy(pcVar4,data,(long)field->len);
    iVar7 = (int)sVar3;
    iVar2 = field->len - iVar7;
    if (iVar2 != 0 && iVar7 <= field->len) {
      memset(pcVar4 + iVar7,0,(long)iVar2);
      return 0;
    }
    return 0;
  }
  if (iVar2 == 4) {
    local_40 = field->name;
    uVar8 = 0;
    while( true ) {
      if ((long)field->len <= (long)uVar8) {
        return 0;
      }
      iVar2 = __isoc99_sscanf(data," %d%n",&val,&local_48);
      if (iVar2 != 1) goto LAB_0010b887;
      if ((short)val != val) break;
      *(short *)((long)basep + uVar8 * 2 + (long)field->offset) = (short)val;
      if (1 < g_debug) {
        fprintf(_stderr,"+d setting posn %d of \'%s\' to %d\n",uVar8 & 0xffffffff,local_40);
      }
      data = data + local_48;
      uVar8 = uVar8 + 1;
    }
    uVar5 = 0x8000;
    uVar6 = 0x7fff;
LAB_0010b907:
    fprintf(_stderr,"** mod val #%d (= %d) outside byte range [-%d,%d]\n",uVar8 & 0xffffffff,
            (ulong)(uint)val,uVar5,uVar6);
    return 1;
  }
  if (iVar2 == 8) {
    local_40 = field->name;
    uVar8 = 0;
    while( true ) {
      if ((long)field->len <= (long)uVar8) {
        return 0;
      }
      iVar2 = __isoc99_sscanf(data," %d%n",&val,&local_48);
      if (iVar2 != 1) break;
      *(int *)((long)basep + uVar8 * 4 + (long)field->offset) = val;
      if (1 < g_debug) {
        fprintf(_stderr,"+d setting posn %d of \'%s\' to %d\n",uVar8 & 0xffffffff,local_40);
      }
      data = data + local_48;
      uVar8 = uVar8 + 1;
    }
  }
  else {
    if (iVar2 != 0x10) {
      if (iVar2 != 0x100) {
        pcVar4 = "** refusing to modify a pointer field, \'%s\'\n";
        goto LAB_0010b83b;
      }
      local_40 = field->name;
      uVar8 = 0;
      while( true ) {
        if ((long)field->len <= (long)uVar8) {
          return 0;
        }
        iVar2 = __isoc99_sscanf(data," %d%n",&val,&local_48);
        if (iVar2 != 1) goto LAB_0010b887;
        if ((char)val != val) break;
        *(char *)((long)basep + uVar8 + (long)field->offset) = (char)val;
        if (1 < g_debug) {
          fprintf(_stderr,"+d setting posn %d of \'%s\' to %d\n",uVar8 & 0xffffffff,local_40);
        }
        data = data + local_48;
        uVar8 = uVar8 + 1;
      }
      uVar6 = 0x7f;
      uVar5 = 0x80;
      goto LAB_0010b907;
    }
    local_40 = field->name;
    uVar8 = 0;
    while( true ) {
      if ((long)field->len <= (long)uVar8) {
        return 0;
      }
      iVar2 = __isoc99_sscanf(data," %f%n",&fval,&local_48);
      if (iVar2 != 1) break;
      *(float *)((long)basep + uVar8 * 4 + (long)field->offset) = fval;
      if (1 < g_debug) {
        fprintf(_stderr,"+d setting posn %d of \'%s\' to %f\n",(double)fval,uVar8 & 0xffffffff,
                local_40);
      }
      data = data + local_48;
      uVar8 = uVar8 + 1;
    }
  }
  uVar1 = field->len;
LAB_0010b89e:
  fprintf(_stderr,"** found %d of %d modify values\n",uVar8 & 0xffffffff,(ulong)uVar1);
  return 1;
LAB_0010b887:
  uVar1 = field->len;
  goto LAB_0010b89e;
}

Assistant:

int modify_field(void * basep, field_s * field, char * data)
{
   float   fval;
   char  * posn = data;
   int     val, max, fc, nchars;

   if( g_debug > 1 )
      fprintf(stderr,"+d modifying field '%s' with '%s'\n", field->name, data);

   if( !data || strlen(data) == 0 )
   {
      fprintf(stderr,"** no data for '%s' field modification\n",field->name);
      return 1;
   }

   switch( field->type )
   {
         case DT_UNKNOWN:
         case NT_DT_POINTER:
         case NT_DT_CHAR_PTR:
         case NT_DT_EXT_PTR:
         default:
            fprintf(stderr,"** refusing to modify a pointer field, '%s'\n",
                    field->name);
            return 1;

         case DT_INT8:
         {
            max = 127;
            for( fc = 0; fc < field->len; fc++ )
            {
               if( sscanf(posn, " %d%n", &val, &nchars) != 1 )
               {
                  fprintf(stderr,"** found %d of %d modify values\n",
                          fc,field->len);
                  return 1;
               }
               if( val > max || val < -(max+1) )
               {
                  fprintf(stderr,
                    "** mod val #%d (= %d) outside byte range [-%d,%d]\n",
                    fc, val, max+1, max);
                  return 1;
               }
               /* otherwise, we're good */
               (((char *)basep + field->offset))[fc] = (char)val;
               if( g_debug > 1 )
                  fprintf(stderr,"+d setting posn %d of '%s' to %d\n",
                          fc, field->name, val);
               posn += nchars;
            }
         }
         break;

         case DT_INT16:
         {
            max = 32767;
            for( fc = 0; fc < field->len; fc++ )
            {
               if( sscanf(posn, " %d%n", &val, &nchars) != 1 )
               {
                  fprintf(stderr,"** found %d of %d modify values\n",
                          fc,field->len);
                  return 1;
               }
               if( val > max || val < -(max+1) )
               {
                  fprintf(stderr,
                    "** mod val #%d (= %d) outside byte range [-%d,%d]\n",
                    fc, val, max+1, max);
                  return 1;
               }
               /* otherwise, we're good */
               ((short *)((char *)basep + field->offset))[fc] = (short)val;
               if( g_debug > 1 )
                  fprintf(stderr,"+d setting posn %d of '%s' to %d\n",
                          fc, field->name, val);
               posn += nchars;
            }
         }
         break;

         case DT_INT32:
         {
            for( fc = 0; fc < field->len; fc++ )
            {
               if( sscanf(posn, " %d%n", &val, &nchars) != 1 )
               {
                  fprintf(stderr,"** found %d of %d modify values\n",
                          fc,field->len);
                  return 1;
               }
               ((int *)((char *)basep + field->offset))[fc] = val;
               if( g_debug > 1 )
                  fprintf(stderr,"+d setting posn %d of '%s' to %d\n",
                          fc, field->name, val);
               posn += nchars;
            }
         }
         break;

         case DT_FLOAT32:
         {
            for( fc = 0; fc < field->len; fc++ )
            {
               if( sscanf(posn, " %f%n", &fval, &nchars) != 1 )
               {
                  fprintf(stderr,"** found %d of %d modify values\n",
                          fc,field->len);
                  return 1;
               }
               /* otherwise, we're good */
               ((float *)((char *)basep + field->offset))[fc] = fval;
               if( g_debug > 1 )
                  fprintf(stderr,"+d setting posn %d of '%s' to %f\n",
                          fc, field->name, fval);
               posn += nchars;
            }
         }
         break;

         case NT_DT_STRING:
         {
            char * dest = (char *)basep + field->offset;
            nchars = strlen(data);
            strncpy(dest, data, field->len);
            if( nchars < field->len )  /* clear the rest */
               memset(dest+nchars, '\0', field->len-nchars);
         }
         break;
   }

   return 0;
}